

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_removeAllModels_Test::~Importer_removeAllModels_Test(Importer_removeAllModels_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, removeAllModels)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/diamond.cellml"));
    auto importer = libcellml::Importer::create();
    importer->resolveImports(model, resourcePath("importer/"));

    EXPECT_EQ(size_t(3), importer->libraryCount());

    importer->removeAllModels();

    EXPECT_EQ(size_t(0), importer->libraryCount());
}